

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv2022.cpp
# Opt level: O3

void UConverter_fromUnicode_ISO_2022_JP_OFFSETS_LOGIC
               (UConverterFromUnicodeArgs *args,UErrorCode *err)

{
  char cVar1;
  UChar UVar2;
  ushort uVar3;
  char *targetLimit;
  UChar *pUVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  byte bVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  UConverter *cnv;
  byte bVar14;
  uint uVar15;
  char *pcVar16;
  char *pcVar17;
  void *pvVar18;
  ulong uVar19;
  byte bVar20;
  uint uVar21;
  uint uVar22;
  int iVar23;
  UChar *pUVar24;
  ulong uVar25;
  bool bVar26;
  ulong local_e8;
  uint local_d8;
  char buffer [8];
  char *local_c0;
  UConverterFromUnicodeArgs *local_b8;
  int *local_b0;
  uint local_a4;
  uint local_a0;
  uint local_9c;
  void *local_98;
  UErrorCode *local_90;
  UConverter *local_88;
  UChar *local_80;
  UChar *local_78;
  long local_70;
  uint local_68;
  uint local_64;
  uint local_60;
  uint local_5c;
  uint local_58;
  byte bStack_53;
  int8_t choices [10];
  
  cnv = args->converter;
  pUVar24 = args->source;
  pcVar16 = args->target;
  targetLimit = args->targetLimit;
  local_80 = args->sourceLimit;
  local_b0 = args->offsets;
  pvVar18 = cnv->extraInfo;
  local_d8 = 0;
  uVar19 = 0;
  local_b8 = args;
  local_98 = pvVar18;
  local_90 = err;
  local_88 = cnv;
  uVar5 = cnv->fromUChar32;
  if (cnv->fromUChar32 != 0 && pcVar16 < targetLimit) goto LAB_0030a073;
LAB_0030a03c:
  if (pUVar24 < local_80) {
    if (pcVar16 < targetLimit) {
      UVar2 = *pUVar24;
      local_e8 = (ulong)(ushort)UVar2;
      pUVar24 = pUVar24 + 1;
      pcVar17 = pcVar16;
      if ((UVar2 & 0xf800U) != 0xd800) {
LAB_0030a0b4:
        if (((int)(uint)local_e8 < 0x20) && ((0x800c000U >> ((uint)local_e8 & 0x1f) & 1) != 0))
        goto LAB_0030a7fd;
        if ((int)uVar19 == 0) {
          uVar3 = jpCharsetMasks[*(uint *)((long)pvVar18 + 0x6c)];
          bVar26 = *(uint *)((long)pvVar18 + 0x6c) - 3 < 2;
          if (bVar26) {
            choices[0] = '\b';
          }
          uVar22 = (uint)bVar26;
          bVar8 = *(byte *)((long)pvVar18 + 0x62);
          uVar25 = (ulong)uVar22;
          choices[uVar25] = bVar8;
          uVar19 = uVar25 + 1;
          uVar5 = (uint)uVar3 & ~(1 << (bVar8 & 0x1f)) & 0xfeff;
          bVar8 = *(byte *)((long)pvVar18 + 100);
          if (bVar8 != 0) {
            choices[uVar25 + 1] = bVar8;
            uVar5 = uVar5 & ~(1 << (bVar8 & 0x1f));
            uVar19 = (ulong)(uVar22 | 2);
          }
          lVar13 = 0;
          do {
            bVar8 = (byte)*(uint *)((long)jpCharsetPref + lVar13);
            if ((uVar5 >> (*(uint *)((long)jpCharsetPref + lVar13) & 0x1f) & 1) != 0) {
              iVar23 = (int)uVar19;
              uVar19 = (ulong)(iVar23 + 1);
              choices[iVar23] = bVar8;
              uVar5 = uVar5 & ~(1 << (bVar8 & 0x1f));
            }
            lVar13 = lVar13 + 4;
          } while (lVar13 != 0x24);
        }
        local_78 = pUVar24;
        if (0 < (int)uVar19) {
          cVar1 = cnv->useFallback;
          local_70 = (long)((int)(uint)local_e8 >> 10);
          uVar15 = (uint)(local_e8 >> 4) & 0x3f;
          uVar5 = (uint)local_e8 & 0xf;
          uVar22 = 0x10000 << (sbyte)uVar5;
          local_a0 = (uint)local_e8 - 0xe000;
          local_a4 = (uint)local_e8 - 0xf0000;
          uVar21 = (uint)local_e8 - 0xff61;
          local_64 = (uint)local_e8 - 0xfec0;
          local_68 = (uint)local_e8 - 0xff40;
          local_58 = (uint)local_e8 - 0xa0;
          local_60 = (uint)local_e8 - 0x80;
          iVar23 = 0;
          uVar25 = 1;
          bVar14 = 0;
          local_9c = uVar22;
          bVar8 = 0;
LAB_0030a22c:
          bVar20 = choices[uVar25 - 1];
          switch(bVar20) {
          case 0:
            if (0x7f < (int)(uint)local_e8) goto LAB_0030a794;
LAB_0030a7e8:
            bVar14 = 0;
            local_d8 = (uint)local_e8;
            break;
          case 1:
            if (0x5f < local_58) goto LAB_0030a794;
            bVar14 = 2;
            local_d8 = local_60;
            break;
          case 2:
            lVar13 = *(long *)((long)pvVar18 + 0x10);
            if (((int)(uint)local_e8 < 0x10000) || ((*(byte *)(lVar13 + 0xfd) & 1) != 0)) {
              uVar3 = *(ushort *)
                       (*(long *)(lVar13 + 0xe8) +
                       (ulong)(*(ushort *)
                                (*(long *)(lVar13 + 0x58) +
                                (ulong)(*(ushort *)(*(long *)(lVar13 + 0x58) + local_70 * 2) +
                                       uVar15) * 2) + uVar5) * 2);
              iVar10 = 1;
              if (uVar3 < 0xf00) {
                if (cVar1 == '\0') {
                  iVar10 = -1;
                  if (0xbff < uVar3) goto LAB_0030a591;
                  cVar1 = '\0';
                }
                else {
                  iVar10 = -1;
                  if (0x7ff < uVar3) goto LAB_0030a591;
                }
              }
              else {
LAB_0030a591:
                if ((byte)uVar3 - 0xa0 < 0x60 && (iVar23 == 0 || 0xeff < uVar3)) {
                  local_d8 = (byte)uVar3 - 0x80;
                  cVar1 = '\0';
                  bVar14 = 2;
                  iVar23 = iVar10;
                  bVar8 = 2;
                }
              }
            }
            goto LAB_0030a794;
          case 3:
            if ((uint)local_e8 < 0x80) {
              if (((uint)local_e8 == 0x5c) || ((uint)local_e8 == 0x7e)) goto LAB_0030a794;
              goto LAB_0030a7e8;
            }
            if ((uint)local_e8 == 0xa5) {
              local_d8 = 0x5c;
            }
            else {
              if ((uint)local_e8 != 0x203e) goto LAB_0030a794;
              bVar20 = 3;
              local_d8 = 0x7e;
            }
            bVar14 = 0;
            break;
          case 4:
            lVar13 = *(long *)((long)pvVar18 + 0x20);
            if ((0xffff < (int)(uint)local_e8) && ((*(byte *)(lVar13 + 0xfd) & 1) == 0))
            goto LAB_0030a3d2;
            uVar6 = *(uint *)(*(long *)(lVar13 + 0x58) +
                             (ulong)(*(ushort *)(*(long *)(lVar13 + 0x58) + local_70 * 2) + uVar15)
                             * 4);
            uVar3 = *(ushort *)
                     (*(long *)(lVar13 + 0xe8) + (ulong)((uVar6 & 0xffff) << 4 | uVar5) * 2);
            uVar12 = (uint)uVar3;
            uVar11 = (uint)uVar3;
            if ((uVar6 & uVar22) == 0) {
              if ((cVar1 == '\0') && (0x18ff < local_a0)) {
                if ((local_a4 < 0x20000) && (uVar3 != 0)) goto LAB_0030a689;
LAB_0030a3d2:
                if (*(int32_t **)(lVar13 + 0x120) == (int32_t *)0x0) goto LAB_0030a749;
                uVar6 = ucnv_extSimpleMatchFromU_63
                                  (*(int32_t **)(lVar13 + 0x120),(uint)local_e8,
                                   (uint32_t *)&local_c0,cVar1);
                iVar10 = 2;
                pvVar18 = local_98;
                uVar22 = local_9c;
                if (uVar6 != 2) goto LAB_0030a693;
              }
              else {
                if (uVar3 == 0) goto LAB_0030a3d2;
LAB_0030a689:
                uVar6 = uVar3 < 0x100 | 0xfffffffe;
                local_c0 = (char *)CONCAT44(local_c0._4_4_,uVar11);
LAB_0030a693:
                iVar10 = -2;
                if (uVar6 != 0xfffffffe || iVar23 != 0) goto LAB_0030a749;
              }
              uVar12 = (uint)local_c0;
            }
            else {
              local_c0 = (char *)CONCAT44(local_c0._4_4_,uVar11);
              iVar10 = 2;
              if (uVar11 < 0x100) {
LAB_0030a749:
                if (((iVar23 == 0) && (cVar1 != '\0')) && (iVar23 = 0, uVar21 < 0x3f)) {
                  local_d8 = (uint)hwkana_fb[uVar21];
                  cVar1 = '\0';
                  bVar14 = 0;
                  iVar23 = -2;
                  bVar8 = 4;
                }
                goto LAB_0030a794;
              }
            }
            if (uVar12 < 0xeffd) {
              iVar23 = (uint)((uVar12 & 0xff00) < 0x9f01) * 0x4000 + (uVar12 & 0xff00);
              uVar12 = uVar12 & 0xff;
              uVar6 = uVar12 < 0x7f | 0xffffffe0;
              local_d8 = iVar23 * 2 - 0x16100;
              if (0x9e < uVar12) {
                uVar6 = 0xffffff82;
                local_d8 = iVar23 * 2 - 0x16000;
              }
              local_d8 = uVar6 + uVar12 | local_d8;
              bVar20 = 4;
              goto LAB_0030a72f;
            }
            goto LAB_0030a794;
          default:
            lVar13 = *(long *)((long)pvVar18 + (long)(char)bVar20 * 8);
            if ((0xffff < (int)(uint)local_e8) && ((*(byte *)(lVar13 + 0xfd) & 1) == 0))
            goto LAB_0030a311;
            uVar6 = *(uint *)(*(long *)(lVar13 + 0x58) +
                             (ulong)(*(ushort *)(*(long *)(lVar13 + 0x58) + local_70 * 2) + uVar15)
                             * 4);
            uVar3 = *(ushort *)
                     (*(long *)(lVar13 + 0xe8) + (ulong)((uVar6 & 0xffff) << 4 | uVar5) * 2);
            uVar11 = (uint)uVar3;
            if ((uVar6 & uVar22) == 0) {
              if ((cVar1 == '\0') && (0x18ff < local_a0)) {
                if ((local_a4 < 0x20000) && (uVar3 != 0)) goto LAB_0030a5ee;
LAB_0030a311:
                if (*(int32_t **)(lVar13 + 0x120) == (int32_t *)0x0) goto LAB_0030a794;
                local_5c = uVar5;
                uVar6 = ucnv_extSimpleMatchFromU_63
                                  (*(int32_t **)(lVar13 + 0x120),(uint)local_e8,
                                   (uint32_t *)&local_c0,cVar1);
                iVar10 = 2;
                pvVar18 = local_98;
                uVar5 = local_5c;
                uVar22 = local_9c;
                if (uVar6 == 2) goto LAB_0030a609;
              }
              else {
                if (uVar3 == 0) goto LAB_0030a311;
LAB_0030a5ee:
                uVar6 = uVar3 < 0x100 | 0xfffffffe;
                local_c0 = (char *)CONCAT44(local_c0._4_4_,uVar11);
              }
              iVar10 = -2;
              if (uVar6 != 0xfffffffe || iVar23 != 0) goto LAB_0030a794;
            }
            else {
              local_c0 = (char *)CONCAT44(local_c0._4_4_,uVar11);
              iVar10 = 2;
              if (uVar11 < 0x100) goto LAB_0030a794;
            }
LAB_0030a609:
            if (bVar20 == 7) {
              if (((0x5d5d < ((uint)local_c0 + 0x5e5f & 0xfffe)) ||
                  (0x5d < ((uint)local_c0 + 0x5f & 0xfe))) || ((uint)local_c0 - 0x8080 == 0))
              goto LAB_0030a794;
              bVar20 = 7;
              local_d8 = (uint)local_c0 - 0x8080;
            }
            else {
              local_d8 = (uint)local_c0;
            }
LAB_0030a72f:
            cVar1 = '\0';
            bVar14 = 0;
            iVar23 = iVar10;
            bVar8 = bVar20;
LAB_0030a794:
            bVar20 = bVar8;
            if ((uVar19 <= uVar25) || (uVar25 = uVar25 + 1, bVar8 = bVar20, 0 < iVar23))
            goto LAB_0030a7b1;
            goto LAB_0030a22c;
          case 8:
            if (0x3e < uVar21) goto LAB_0030a794;
            if (*(int *)((long)pvVar18 + 0x6c) == 4) {
              bVar20 = 3;
              if ((*(byte *)((long)pvVar18 + 0x62) & 0xfc) != 4) {
                bVar20 = *(byte *)((long)pvVar18 + 0x62);
              }
              bVar14 = 0;
              local_d8 = local_64;
            }
            else {
              if (*(int *)((long)pvVar18 + 0x6c) != 3) goto LAB_0030a794;
              *(undefined1 *)((long)pvVar18 + 99) = 8;
              bVar14 = 1;
              bVar20 = 8;
              local_d8 = local_68;
            }
          }
          iVar23 = 1;
          goto LAB_0030a868;
        }
        goto LAB_0030a7c4;
      }
      local_e8._0_4_ = (uint)(ushort)UVar2;
      uVar5 = (uint)(ushort)UVar2;
      if (((ushort)UVar2 >> 10 & 1) == 0) {
LAB_0030a073:
        local_e8._0_4_ = uVar5;
        if (local_80 <= pUVar24) {
          cnv->fromUChar32 = (uint)local_e8;
          goto LAB_0030aa8f;
        }
        UVar2 = *pUVar24;
        pcVar17 = pcVar16;
        if (((ushort)UVar2 & 0xfc00) == 0xdc00) {
          pUVar24 = pUVar24 + 1;
          local_e8 = (ulong)((uint)local_e8 * 0x400 + (uint)(ushort)UVar2 + 0xfca02400);
          cnv->fromUChar32 = 0;
          goto LAB_0030a0b4;
        }
      }
LAB_0030a7fd:
      *err = U_ILLEGAL_CHAR_FOUND;
      cnv->fromUChar32 = (uint)local_e8;
      local_c0 = pcVar17;
    }
    else {
      *err = U_BUFFER_OVERFLOW_ERROR;
      local_c0 = pcVar16;
    }
  }
  else {
LAB_0030aa8f:
    local_c0 = pcVar16;
    if ((*err < U_ILLEGAL_ARGUMENT_ERROR) &&
       ((((*(char *)((long)pvVar18 + 0x66) != '\0' || (*(char *)((long)pvVar18 + 0x62) != '\0')) &&
         (local_b8->flush != '\0')) && ((local_80 <= pUVar24 && (cnv->fromUChar32 == 0)))))) {
      bVar26 = *(char *)((long)pvVar18 + 0x66) != '\0';
      if (bVar26) {
        buffer[0] = '\x0f';
        *(undefined1 *)((long)pvVar18 + 0x66) = 0;
      }
      uVar5 = (uint)bVar26;
      if (*(char *)((long)pvVar18 + 0x62) != '\0') {
        buffer[(ulong)bVar26 + 2] = 'B';
        (buffer + bVar26)[0] = '\x1b';
        (buffer + bVar26)[1] = '(';
        uVar5 = uVar5 + 3;
        *(undefined1 *)((long)pvVar18 + 0x62) = 0;
      }
      pUVar4 = local_b8->source;
      iVar23 = (int)((ulong)((long)pUVar24 - (long)pUVar4) >> 1);
      if (iVar23 < 1) {
        uVar22 = 0xffffffff;
      }
      else {
        uVar22 = iVar23 - 1;
        if (((pUVar4[uVar22] & 0xfc00U) == 0xdc00) &&
           ((uVar22 == 0 || ((pUVar4[iVar23 - 2] & 0xfc00U) == 0xd800)))) {
          uVar22 = iVar23 - 2;
        }
      }
      ucnv_fromUWriteBytes_63(cnv,buffer,uVar5,&local_c0,targetLimit,&local_b0,uVar22,err);
    }
  }
  goto LAB_0030aada;
LAB_0030a7b1:
  cnv = local_88;
  if (iVar23 == 0) {
LAB_0030a7c4:
    *local_90 = U_INVALID_CHAR_FOUND;
    cnv->fromUChar32 = (uint)local_e8;
    local_c0 = pcVar17;
    pUVar24 = local_78;
    goto LAB_0030aada;
  }
LAB_0030a868:
  iVar10 = -iVar23;
  if (0 < iVar23) {
    iVar10 = iVar23;
  }
  bVar8 = *(byte *)((long)pvVar18 + 0x66);
  bVar26 = bVar8 == 1;
  if (bVar26 && bVar14 == 0) {
    buffer[0] = '\x0f';
    *(undefined1 *)((long)pvVar18 + 0x66) = 0;
    bVar8 = 0;
  }
  bVar26 = bVar26 && bVar14 == 0;
  uVar25 = (ulong)bVar26;
  if (bVar20 != *(byte *)((long)pvVar18 + (ulong)bVar14 + 0x62)) {
    cVar1 = "\x03\x03\x03\x03\x03\x04\x03\x04\x03"[(char)bVar20];
    memcpy(buffer + uVar25,escSeqChars + (char)bVar20,(long)cVar1);
    uVar25 = (ulong)((uint)bVar26 + (int)cVar1);
    *(byte *)((long)local_98 + (ulong)bVar14 + 0x62) = bVar20;
    bVar8 = *(byte *)((long)local_98 + 0x66);
    uVar19 = 0;
    pvVar18 = local_98;
  }
  pUVar24 = local_78;
  cnv = local_88;
  err = local_90;
  iVar7 = (int)uVar25;
  iVar23 = iVar7;
  if (bVar14 != bVar8) {
    iVar23 = iVar7 + 1;
    if (bVar14 == 1) {
      buffer[iVar7] = '\x0e';
      *(undefined1 *)((long)pvVar18 + 0x66) = 1;
    }
    else {
      buffer[iVar7] = '\x1b';
      iVar23 = iVar7 + 2;
      buffer[(long)iVar7 + 1] = 'N';
    }
  }
  iVar9 = 1;
  iVar7 = iVar23;
  if (iVar10 != 1) {
    iVar7 = iVar23 + 1;
    buffer[iVar23] = (char)(local_d8 >> 8);
    iVar9 = 2;
  }
  iVar23 = iVar23 + iVar9;
  buffer[iVar7] = (char)local_d8;
  if (((uint)local_e8 == 0xd) || ((uint)local_e8 == 10)) {
    *(undefined1 *)((long)pvVar18 + 100) = 0;
    uVar19 = 0;
  }
  if (iVar23 == 2) {
    pcVar16 = pcVar17 + 2;
    if (pcVar16 <= targetLimit) {
      *pcVar17 = buffer[0];
      pcVar17[1] = buffer[1];
      if (local_b0 != (int *)0x0) {
        iVar23 = -1;
        if (0xffff < (uint)local_e8) {
          iVar23 = -2;
        }
        iVar23 = (int)((ulong)((long)pUVar24 - (long)local_b8->source) >> 1) + iVar23;
        *local_b0 = iVar23;
        local_b0[1] = iVar23;
        local_b0 = local_b0 + 2;
      }
      goto LAB_0030a03c;
    }
  }
  else if (iVar23 == 1) {
    *pcVar17 = buffer[0];
    pcVar16 = pcVar17 + 1;
    if (local_b0 != (int *)0x0) {
      *local_b0 = (int)((ulong)((long)pUVar24 - (long)local_b8->source) >> 1) + -1;
      local_b0 = local_b0 + 1;
    }
    goto LAB_0030a03c;
  }
  iVar10 = -1;
  if (0xffff < (uint)local_e8) {
    iVar10 = -2;
  }
  local_c0 = pcVar17;
  ucnv_fromUWriteBytes_63
            (cnv,buffer,iVar23,&local_c0,targetLimit,&local_b0,
             (int)((ulong)((long)pUVar24 - (long)local_b8->source) >> 1) + iVar10,err);
  pcVar16 = local_c0;
  pvVar18 = local_98;
  if (U_ZERO_ERROR < *err) {
LAB_0030aada:
    local_b8->source = pUVar24;
    local_b8->target = local_c0;
    return;
  }
  goto LAB_0030a03c;
}

Assistant:

static void U_CALLCONV
UConverter_fromUnicode_ISO_2022_JP_OFFSETS_LOGIC(UConverterFromUnicodeArgs* args, UErrorCode* err) {
    UConverter *cnv = args->converter;
    UConverterDataISO2022 *converterData;
    ISO2022State *pFromU2022State;
    uint8_t *target = (uint8_t *) args->target;
    const uint8_t *targetLimit = (const uint8_t *) args->targetLimit;
    const UChar* source = args->source;
    const UChar* sourceLimit = args->sourceLimit;
    int32_t* offsets = args->offsets;
    UChar32 sourceChar;
    char buffer[8];
    int32_t len, outLen;
    int8_t choices[10];
    int32_t choiceCount;
    uint32_t targetValue = 0;
    UBool useFallback;

    int32_t i;
    int8_t cs, g;

    /* set up the state */
    converterData     = (UConverterDataISO2022*)cnv->extraInfo;
    pFromU2022State   = &converterData->fromU2022State;

    choiceCount = 0;

    /* check if the last codepoint of previous buffer was a lead surrogate*/
    if((sourceChar = cnv->fromUChar32)!=0 && target< targetLimit) {
        goto getTrail;
    }

    while(source < sourceLimit) {
        if(target < targetLimit) {

            sourceChar  = *(source++);
            /*check if the char is a First surrogate*/
            if(U16_IS_SURROGATE(sourceChar)) {
                if(U16_IS_SURROGATE_LEAD(sourceChar)) {
getTrail:
                    /*look ahead to find the trail surrogate*/
                    if(source < sourceLimit) {
                        /* test the following code unit */
                        UChar trail=(UChar) *source;
                        if(U16_IS_TRAIL(trail)) {
                            source++;
                            sourceChar=U16_GET_SUPPLEMENTARY(sourceChar, trail);
                            cnv->fromUChar32=0x00;
                            /* convert this supplementary code point */
                            /* exit this condition tree */
                        } else {
                            /* this is an unmatched lead code unit (1st surrogate) */
                            /* callback(illegal) */
                            *err=U_ILLEGAL_CHAR_FOUND;
                            cnv->fromUChar32=sourceChar;
                            break;
                        }
                    } else {
                        /* no more input */
                        cnv->fromUChar32=sourceChar;
                        break;
                    }
                } else {
                    /* this is an unmatched trail code unit (2nd surrogate) */
                    /* callback(illegal) */
                    *err=U_ILLEGAL_CHAR_FOUND;
                    cnv->fromUChar32=sourceChar;
                    break;
                }
            }

            /* do not convert SO/SI/ESC */
            if(IS_2022_CONTROL(sourceChar)) {
                /* callback(illegal) */
                *err=U_ILLEGAL_CHAR_FOUND;
                cnv->fromUChar32=sourceChar;
                break;
            }

            /* do the conversion */

            if(choiceCount == 0) {
                uint16_t csm;

                /*
                 * The csm variable keeps track of which charsets are allowed
                 * and not used yet while building the choices[].
                 */
                csm = jpCharsetMasks[converterData->version];
                choiceCount = 0;

                /* JIS7/8: try single-byte half-width Katakana before JISX208 */
                if(converterData->version == 3 || converterData->version == 4) {
                    choices[choiceCount++] = (int8_t)HWKANA_7BIT;
                }
                /* Do not try single-byte half-width Katakana for other versions. */
                csm &= ~CSM(HWKANA_7BIT);

                /* try the current G0 charset */
                choices[choiceCount++] = cs = pFromU2022State->cs[0];
                csm &= ~CSM(cs);

                /* try the current G2 charset */
                if((cs = pFromU2022State->cs[2]) != 0) {
                    choices[choiceCount++] = cs;
                    csm &= ~CSM(cs);
                }

                /* try all the other possible charsets */
                for(i = 0; i < UPRV_LENGTHOF(jpCharsetPref); ++i) {
                    cs = (int8_t)jpCharsetPref[i];
                    if(CSM(cs) & csm) {
                        choices[choiceCount++] = cs;
                        csm &= ~CSM(cs);
                    }
                }
            }

            cs = g = 0;
            /*
             * len==0: no mapping found yet
             * len<0: found a fallback result: continue looking for a roundtrip but no further fallbacks
             * len>0: found a roundtrip result, done
             */
            len = 0;
            /*
             * We will turn off useFallback after finding a fallback,
             * but we still get fallbacks from PUA code points as usual.
             * Therefore, we will also need to check that we don't overwrite
             * an early fallback with a later one.
             */
            useFallback = cnv->useFallback;

            for(i = 0; i < choiceCount && len <= 0; ++i) {
                uint32_t value;
                int32_t len2;
                int8_t cs0 = choices[i];
                switch(cs0) {
                case ASCII:
                    if(sourceChar <= 0x7f) {
                        targetValue = (uint32_t)sourceChar;
                        len = 1;
                        cs = cs0;
                        g = 0;
                    }
                    break;
                case ISO8859_1:
                    if(GR96_START <= sourceChar && sourceChar <= GR96_END) {
                        targetValue = (uint32_t)sourceChar - 0x80;
                        len = 1;
                        cs = cs0;
                        g = 2;
                    }
                    break;
                case HWKANA_7BIT:
                    if((uint32_t)(sourceChar - HWKANA_START) <= (HWKANA_END - HWKANA_START)) {
                        if(converterData->version==3) {
                            /* JIS7: use G1 (SO) */
                            /* Shift U+FF61..U+FF9F to bytes 21..5F. */
                            targetValue = (uint32_t)(sourceChar - (HWKANA_START - 0x21));
                            len = 1;
                            pFromU2022State->cs[1] = cs = cs0; /* do not output an escape sequence */
                            g = 1;
                        } else if(converterData->version==4) {
                            /* JIS8: use 8-bit bytes with any single-byte charset, see escape sequence output below */
                            /* Shift U+FF61..U+FF9F to bytes A1..DF. */
                            targetValue = (uint32_t)(sourceChar - (HWKANA_START - 0xa1));
                            len = 1;

                            cs = pFromU2022State->cs[0];
                            if(IS_JP_DBCS(cs)) {
                                /* switch from a DBCS charset to JISX201 */
                                cs = (int8_t)JISX201;
                            }
                            /* else stay in the current G0 charset */
                            g = 0;
                        }
                        /* else do not use HWKANA_7BIT with other versions */
                    }
                    break;
                case JISX201:
                    /* G0 SBCS */
                    value = jisx201FromU(sourceChar);
                    if(value <= 0x7f) {
                        targetValue = value;
                        len = 1;
                        cs = cs0;
                        g = 0;
                        useFallback = FALSE;
                    }
                    break;
                case JISX208:
                    /* G0 DBCS from Shift-JIS table */
                    len2 = MBCS_FROM_UCHAR32_ISO2022(
                                converterData->myConverterArray[cs0],
                                sourceChar, &value,
                                useFallback, MBCS_OUTPUT_2);
                    if(len2 == 2 || (len2 == -2 && len == 0)) {  /* only accept DBCS: abs(len)==2 */
                        value = _2022FromSJIS(value);
                        if(value != 0) {
                            targetValue = value;
                            len = len2;
                            cs = cs0;
                            g = 0;
                            useFallback = FALSE;
                        }
                    } else if(len == 0 && useFallback &&
                              (uint32_t)(sourceChar - HWKANA_START) <= (HWKANA_END - HWKANA_START)) {
                        targetValue = hwkana_fb[sourceChar - HWKANA_START];
                        len = -2;
                        cs = cs0;
                        g = 0;
                        useFallback = FALSE;
                    }
                    break;
                case ISO8859_7:
                    /* G0 SBCS forced to 7-bit output */
                    len2 = MBCS_SINGLE_FROM_UCHAR32(
                                converterData->myConverterArray[cs0],
                                sourceChar, &value,
                                useFallback);
                    if(len2 != 0 && !(len2 < 0 && len != 0) && GR96_START <= value && value <= GR96_END) {
                        targetValue = value - 0x80;
                        len = len2;
                        cs = cs0;
                        g = 2;
                        useFallback = FALSE;
                    }
                    break;
                default:
                    /* G0 DBCS */
                    len2 = MBCS_FROM_UCHAR32_ISO2022(
                                converterData->myConverterArray[cs0],
                                sourceChar, &value,
                                useFallback, MBCS_OUTPUT_2);
                    if(len2 == 2 || (len2 == -2 && len == 0)) {  /* only accept DBCS: abs(len)==2 */
                        if(cs0 == KSC5601) {
                            /*
                             * Check for valid bytes for the encoding scheme.
                             * This is necessary because the sub-converter (windows-949)
                             * has a broader encoding scheme than is valid for 2022.
                             */
                            value = _2022FromGR94DBCS(value);
                            if(value == 0) {
                                break;
                            }
                        }
                        targetValue = value;
                        len = len2;
                        cs = cs0;
                        g = 0;
                        useFallback = FALSE;
                    }
                    break;
                }
            }

            if(len != 0) {
                if(len < 0) {
                    len = -len;  /* fallback */
                }
                outLen = 0; /* count output bytes */

                /* write SI if necessary (only for JIS7) */
                if(pFromU2022State->g == 1 && g == 0) {
                    buffer[outLen++] = UCNV_SI;
                    pFromU2022State->g = 0;
                }

                /* write the designation sequence if necessary */
                if(cs != pFromU2022State->cs[g]) {
                    int32_t escLen = escSeqCharsLen[cs];
                    uprv_memcpy(buffer + outLen, escSeqChars[cs], escLen);
                    outLen += escLen;
                    pFromU2022State->cs[g] = cs;

                    /* invalidate the choices[] */
                    choiceCount = 0;
                }

                /* write the shift sequence if necessary */
                if(g != pFromU2022State->g) {
                    switch(g) {
                    /* case 0 handled before writing escapes */
                    case 1:
                        buffer[outLen++] = UCNV_SO;
                        pFromU2022State->g = 1;
                        break;
                    default: /* case 2 */
                        buffer[outLen++] = 0x1b;
                        buffer[outLen++] = 0x4e;
                        break;
                    /* no case 3: no SS3 in ISO-2022-JP-x */
                    }
                }

                /* write the output bytes */
                if(len == 1) {
                    buffer[outLen++] = (char)targetValue;
                } else /* len == 2 */ {
                    buffer[outLen++] = (char)(targetValue >> 8);
                    buffer[outLen++] = (char)targetValue;
                }
            } else {
                /*
                 * if we cannot find the character after checking all codepages
                 * then this is an error
                 */
                *err = U_INVALID_CHAR_FOUND;
                cnv->fromUChar32=sourceChar;
                break;
            }

            if(sourceChar == CR || sourceChar == LF) {
                /* reset the G2 state at the end of a line (conversion got us into ASCII or JISX201 already) */
                pFromU2022State->cs[2] = 0;
                choiceCount = 0;
            }

            /* output outLen>0 bytes in buffer[] */
            if(outLen == 1) {
                *target++ = buffer[0];
                if(offsets) {
                    *offsets++ = (int32_t)(source - args->source - 1); /* -1: known to be ASCII */
                }
            } else if(outLen == 2 && (target + 2) <= targetLimit) {
                *target++ = buffer[0];
                *target++ = buffer[1];
                if(offsets) {
                    int32_t sourceIndex = (int32_t)(source - args->source - U16_LENGTH(sourceChar));
                    *offsets++ = sourceIndex;
                    *offsets++ = sourceIndex;
                }
            } else {
                fromUWriteUInt8(
                    cnv,
                    buffer, outLen,
                    &target, (const char *)targetLimit,
                    &offsets, (int32_t)(source - args->source - U16_LENGTH(sourceChar)),
                    err);
                if(U_FAILURE(*err)) {
                    break;
                }
            }
        } /* end if(myTargetIndex<myTargetLength) */
        else{
            *err =U_BUFFER_OVERFLOW_ERROR;
            break;
        }

    }/* end while(mySourceIndex<mySourceLength) */

    /*
     * the end of the input stream and detection of truncated input
     * are handled by the framework, but for ISO-2022-JP conversion
     * we need to be in ASCII mode at the very end
     *
     * conditions:
     *   successful
     *   in SO mode or not in ASCII mode
     *   end of input and no truncated input
     */
    if( U_SUCCESS(*err) &&
        (pFromU2022State->g!=0 || pFromU2022State->cs[0]!=ASCII) &&
        args->flush && source>=sourceLimit && cnv->fromUChar32==0
    ) {
        int32_t sourceIndex;

        outLen = 0;

        if(pFromU2022State->g != 0) {
            buffer[outLen++] = UCNV_SI;
            pFromU2022State->g = 0;
        }

        if(pFromU2022State->cs[0] != ASCII) {
            int32_t escLen = escSeqCharsLen[ASCII];
            uprv_memcpy(buffer + outLen, escSeqChars[ASCII], escLen);
            outLen += escLen;
            pFromU2022State->cs[0] = (int8_t)ASCII;
        }

        /* get the source index of the last input character */
        /*
         * TODO this would be simpler and more reliable if we used a pair
         * of sourceIndex/prevSourceIndex like in ucnvmbcs.c
         * so that we could simply use the prevSourceIndex here;
         * this code gives an incorrect result for the rare case of an unmatched
         * trail surrogate that is alone in the last buffer of the text stream
         */
        sourceIndex=(int32_t)(source-args->source);
        if(sourceIndex>0) {
            --sourceIndex;
            if( U16_IS_TRAIL(args->source[sourceIndex]) &&
                (sourceIndex==0 || U16_IS_LEAD(args->source[sourceIndex-1]))
            ) {
                --sourceIndex;
            }
        } else {
            sourceIndex=-1;
        }

        fromUWriteUInt8(
            cnv,
            buffer, outLen,
            &target, (const char *)targetLimit,
            &offsets, sourceIndex,
            err);
    }

    /*save the state and return */
    args->source = source;
    args->target = (char*)target;
}